

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvidiamon.cpp
# Opt level: O2

void __thiscall
nvidiamon::update_stats(nvidiamon *this,vector<int,_std::allocator<int>_> *pids,string *read_path)

{
  _Rb_tree_header *p_Var1;
  level_enum lVar2;
  int *piVar3;
  pointer pbVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  istream *piVar8;
  ostream *poVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  string *this_00;
  pointer pbVar15;
  int *piVar16;
  long lVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uint gpu_idx;
  pid_t pid;
  uint fb_mem;
  uint mem;
  uint sm;
  nvidiamon *local_540;
  MessageBase *local_538;
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cmd_result;
  string local_4f8;
  string jpg;
  string dec;
  string enc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  local_478;
  string cmd_name;
  string ccpm;
  string cg_type;
  string ofa;
  undefined1 local_3c0 [32];
  _Prime_rehash_policy local_3a0;
  __node_base_ptr p_Stack_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string local_358;
  stringstream strm;
  undefined1 local_330 [24];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [232];
  istringstream instr;
  byte abStack_190 [352];
  
  local_540 = this;
  std::__cxx11::string::string((string *)&strm,"nvidia-smi",(allocator *)&instr);
  std::__cxx11::string::string(local_318,"pmon",(allocator *)local_3c0);
  std::__cxx11::string::string(local_2f8,"-s",(allocator *)&local_478);
  std::__cxx11::string::string(local_2d8,"um",(allocator *)&cmd_result);
  std::__cxx11::string::string(local_2b8,"-c",(allocator *)&enc);
  std::__cxx11::string::string(local_298,"1",(allocator *)&dec);
  __l._M_len = 6;
  __l._M_array = (iterator)&strm;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&cmd,__l,(allocator_type *)&jpg);
  lVar17 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(&strm + lVar17));
    lVar17 = lVar17 + -0x20;
  } while (lVar17 != -0x20);
  local_478._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_478._M_impl.super__Rb_tree_header._M_header;
  local_478._M_impl._0_8_ = 0;
  local_478._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_478._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_478._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_478._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(local_540->nvidia_stats)._M_t._M_impl.super__Rb_tree_header;
  local_478._M_impl.super__Rb_tree_header._M_header._M_right =
       local_478._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var6 = (local_540->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                           *)&local_478,(key_type *)(p_Var6 + 1));
    *pmVar5 = 0;
  }
  cmd_result.first = 0;
  cmd_result.second.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmd_result.second.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmd_result.second.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (read_path->_M_string_length == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_388,&cmd);
    prmon::cmd_pipe_output
              ((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&strm,&local_388);
    std::
    pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&cmd_result,(type)&strm);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_388);
    if (cmd_result.first != 0) {
      std::__cxx11::to_string((string *)local_3c0,cmd_result.first);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instr,
                     "Failed to execute \'nvidia-smi\' to get GPU status (code ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&strm,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instr,")"
                    );
      MessageBase::error(&local_540->super_MessageBase,(string *)&strm);
      std::__cxx11::string::~string((string *)&strm);
      std::__cxx11::string::~string((string *)&instr);
      this_00 = (string *)local_3c0;
      goto LAB_001afa31;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_358,(string *)read_path);
    read_gpu_stats_test((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&strm,(nvidiamon *)read_path,&local_358);
    std::
    pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&cmd_result,(type)&strm);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_330);
    std::__cxx11::string::~string((string *)&local_358);
  }
  local_538 = &local_540->super_MessageBase;
  if ((int)(local_540->super_MessageBase).log_level < 2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    poVar7 = std::operator<<((ostream *)(local_330 + 8),
                             "nvidiamon::update_stats got the following output (");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7,"): ");
    std::endl<char,std::char_traits<char>>(poVar7);
    pbVar4 = cmd_result.second.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar12 = 0;
    for (pbVar15 = cmd_result.second.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar4;
        pbVar15 = pbVar15 + 1) {
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)(local_330 + 8),iVar12);
      poVar7 = std::operator<<(poVar7," -> ");
      poVar7 = std::operator<<(poVar7,(string *)pbVar15);
      std::endl<char,std::char_traits<char>>(poVar7);
      iVar12 = iVar12 + 1;
    }
    std::__cxx11::stringbuf::str();
    MessageBase::debug(local_538,(string *)&instr);
    std::__cxx11::string::~string((string *)&instr);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  }
  pbVar4 = cmd_result.second.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  gpu_idx = 0;
  sm = 0;
  mem = 0;
  fb_mem = 0;
  pid = 0;
  enc._M_dataplus._M_p = (pointer)&enc.field_2;
  enc._M_string_length = 0;
  dec._M_dataplus._M_p = (pointer)&dec.field_2;
  dec._M_string_length = 0;
  jpg._M_dataplus._M_p = (pointer)&jpg.field_2;
  jpg._M_string_length = 0;
  enc.field_2._M_local_buf[0] = '\0';
  dec.field_2._M_local_buf[0] = '\0';
  ofa._M_dataplus._M_p = (pointer)&ofa.field_2;
  ofa._M_string_length = 0;
  cg_type._M_dataplus._M_p = (pointer)&cg_type.field_2;
  cg_type._M_string_length = 0;
  jpg.field_2._M_local_buf[0] = '\0';
  ofa.field_2._M_local_buf[0] = '\0';
  ccpm._M_dataplus._M_p = (pointer)&ccpm.field_2;
  ccpm._M_string_length = 0;
  cmd_name._M_dataplus._M_p = (pointer)&cmd_name.field_2;
  cmd_name._M_string_length = 0;
  cg_type.field_2._M_local_buf[0] = '\0';
  ccpm.field_2._M_local_buf[0] = '\0';
  cmd_name.field_2._M_local_buf[0] = '\0';
  local_3c0._0_8_ = &p_Stack_390;
  local_3c0._8_8_ = 1;
  local_3c0._16_8_ = (_Hash_node_base *)0x0;
  local_3c0._24_8_ = 0;
  local_3a0._M_max_load_factor = 1.0;
  local_3a0._4_4_ = 0;
  local_3a0._M_next_resize = 0;
  p_Stack_390 = (__node_base_ptr)0x0;
  for (pbVar15 = cmd_result.second.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar4; pbVar15 = pbVar15 + 1
      ) {
    if (*(pbVar15->_M_dataplus)._M_p != '#') {
      std::__cxx11::istringstream::istringstream((istringstream *)&instr,(string *)pbVar15,_S_in);
      piVar8 = std::istream::_M_extract<unsigned_int>((uint *)&instr);
      piVar8 = (istream *)std::istream::operator>>(piVar8,&pid);
      piVar8 = std::operator>>(piVar8,(string *)&cg_type);
      piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
      piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
      piVar8 = std::operator>>(piVar8,(string *)&enc);
      piVar8 = std::operator>>(piVar8,(string *)&dec);
      piVar8 = std::operator>>(piVar8,(string *)&jpg);
      piVar8 = std::operator>>(piVar8,(string *)&ofa);
      piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
      piVar8 = std::operator>>(piVar8,(string *)&ccpm);
      std::operator>>(piVar8,(string *)&cmd_name);
      lVar2 = (local_540->super_MessageBase).log_level;
      if ((abStack_190[*(long *)(_instr + -0x18)] & 5) == 0) {
        if ((int)lVar2 < 2) {
          std::__cxx11::stringstream::stringstream((stringstream *)&strm);
          poVar7 = std::operator<<((ostream *)(local_330 + 8),"Good read: ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,pid);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,(string *)&cg_type);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,(string *)&enc);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,(string *)&dec);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,(string *)&jpg);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,(string *)&ofa);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,(string *)&ccpm);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,(string *)&cmd_name);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::stringbuf::str();
          MessageBase::debug(local_538,&local_4f8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
        }
        piVar3 = (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar16 = (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start; piVar16 != piVar3; piVar16 = piVar16 + 1) {
          if (*piVar16 == pid) {
            uVar14 = (ulong)sm;
            std::__cxx11::string::string((string *)&strm,"gpusmpct",(allocator *)&local_4f8);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                   *)&local_478,(key_type *)&strm);
            *pmVar5 = *pmVar5 + uVar14;
            std::__cxx11::string::~string((string *)&strm);
            uVar14 = (ulong)mem;
            std::__cxx11::string::string((string *)&strm,"gpumempct",(allocator *)&local_4f8);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                   *)&local_478,(key_type *)&strm);
            *pmVar5 = *pmVar5 + uVar14;
            std::__cxx11::string::~string((string *)&strm);
            uVar13 = local_540->MB_to_KB * fb_mem;
            std::__cxx11::string::string((string *)&strm,"gpufbmem",(allocator *)&local_4f8);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                   *)&local_478,(key_type *)&strm);
            *pmVar5 = *pmVar5 + (ulong)uVar13;
            std::__cxx11::string::~string((string *)&strm);
            sVar10 = std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)local_3c0,&gpu_idx);
            if (sVar10 == 0) {
              std::__cxx11::string::string((string *)&strm,"ngpus",(allocator *)&local_4f8);
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                     *)&local_478,(key_type *)&strm);
              *pmVar5 = *pmVar5 + 1;
              std::__cxx11::string::~string((string *)&strm);
              pmVar11 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_3c0,&gpu_idx);
              *pmVar11 = true;
            }
          }
        }
        for (p_Var6 = (local_540->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            ; (_Rb_tree_header *)p_Var6 != p_Var1;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                 *)&local_478,(key_type *)(p_Var6 + 1));
          prmon::monitored_value::set_value((monitored_value *)(p_Var6 + 2),*pmVar5);
        }
      }
      else if ((int)lVar2 < 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)&strm);
        poVar7 = (ostream *)(local_330 + 8);
        poVar9 = std::operator<<(poVar7,"Bad read of line: ");
        poVar9 = std::operator<<(poVar9,(string *)pbVar15);
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<(poVar7,"Parsed to: ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,pid);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,(string *)&cg_type);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,(string *)&enc);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,(string *)&dec);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,(string *)&jpg);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,(string *)&ofa);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,(string *)&ccpm);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,(string *)&cmd_name);
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<(poVar7,"StringStream status: good()=");
        std::ostream::_M_insert<bool>(SUB81(poVar9,0));
        poVar9 = std::operator<<(poVar7," eof()=");
        std::ostream::_M_insert<bool>(SUB81(poVar9,0));
        poVar9 = std::operator<<(poVar7," fail()=");
        std::ostream::_M_insert<bool>(SUB81(poVar9,0));
        poVar7 = std::operator<<(poVar7," bad()=");
        poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        MessageBase::debug(local_538,&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&instr);
    }
  }
  if ((int)(local_540->super_MessageBase).log_level < 2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    std::operator<<((ostream *)(local_330 + 8),"Parsed: ");
    for (p_Var6 = (local_540->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      poVar7 = std::operator<<((ostream *)(local_330 + 8),(string *)(p_Var6 + 1));
      poVar7 = std::operator<<(poVar7,": ");
      poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
      std::operator<<(poVar7,";");
    }
    std::__cxx11::stringbuf::str();
    MessageBase::debug(local_538,(string *)&instr);
    std::__cxx11::string::~string((string *)&instr);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_3c0);
  std::__cxx11::string::~string((string *)&cmd_name);
  std::__cxx11::string::~string((string *)&ccpm);
  std::__cxx11::string::~string((string *)&cg_type);
  std::__cxx11::string::~string((string *)&ofa);
  std::__cxx11::string::~string((string *)&jpg);
  std::__cxx11::string::~string((string *)&dec);
  this_00 = &enc;
LAB_001afa31:
  std::__cxx11::string::~string((string *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cmd_result.second);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  ::~_Rb_tree(&local_478);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cmd);
  return;
}

Assistant:

void nvidiamon::update_stats(const std::vector<pid_t>& pids,
                             const std::string read_path) {
  const std::vector<std::string> cmd = {"nvidia-smi", "pmon", "-s",
                                        "um",         "-c",   "1"};
  prmon::monitored_value_map nvidia_stats_update{};
  for (const auto& value : nvidia_stats) nvidia_stats_update[value.first] = 0L;

  std::pair<int, std::vector<std::string>> cmd_result;
  if (read_path.size()) {
    cmd_result = read_gpu_stats_test(read_path);
  } else {
    cmd_result = prmon::cmd_pipe_output(cmd);
    if (cmd_result.first) {
      // Failed
      error("Failed to execute 'nvidia-smi' to get GPU status (code " +
            std::to_string(cmd_result.first) + ")");
      return;
    }
  }
  if (log_level <= spdlog::level::debug) {
    std::stringstream strm;
    strm << "nvidiamon::update_stats got the following output ("
         << cmd_result.second.size() << "): " << std::endl;
    int i = 0;
    for (const auto& s : cmd_result.second) {
      strm << i << " -> " << s << std::endl;
      ++i;
    }
    debug(strm.str());
  }

  // Loop over output
  unsigned int gpu_idx{}, sm{}, mem{}, fb_mem{};
  pid_t pid{};
  std::string enc{}, dec{}, jpg{}, ofa{}, cg_type{}, ccpm{}, cmd_name{};
  std::unordered_map<unsigned int, bool>
      activegpus{};  // Avoid double counting active GPUs
  for (const auto& s : cmd_result.second) {
    if (s[0] == '#') continue;
    std::istringstream instr(s);
    instr >> gpu_idx >> pid >> cg_type >> sm >> mem >> enc >> dec >> jpg >> ofa >> fb_mem >>
          ccpm  >> cmd_name;
    auto read_ok = !(instr.fail() || instr.bad());  // eof() is ok
    if (read_ok) {
      if (log_level <= spdlog::level::debug) {
        std::stringstream strm;
        strm << "Good read: " << gpu_idx << " " << pid << " " << cg_type << " "
             << sm << " " << mem << " " << enc << " " << dec << " " << jpg << " " << ofa << " " << fb_mem << " " << ccpm
             << " " << cmd_name << std::endl;
        debug(strm.str());
      }

      // Filter on PID value, so we only add stats for our processes
      for (auto const p : pids) {
        if (p == pid) {
          nvidia_stats_update["gpusmpct"] += sm;
          nvidia_stats_update["gpumempct"] += mem;
          nvidia_stats_update["gpufbmem"] += fb_mem * MB_to_KB;
          if (!activegpus.count(gpu_idx)) {
            ++nvidia_stats_update["ngpus"];
            activegpus[gpu_idx] = true;
          }
        }
      }

      // Now move summed stats to the persistent counters
      for (auto& value : nvidia_stats) {
        value.second.set_value(nvidia_stats_update[value.first]);
      }
    } else if (log_level <= spdlog::level::debug) {
      std::stringstream strm;
      strm << "Bad read of line: " << s << std::endl;
      strm << "Parsed to: " << gpu_idx << " " << pid << " " << cg_type << " "
           << sm << " " << mem << " " << enc << " " << dec << " " << jpg << " " << ofa << " " << fb_mem << " " << ccpm
           << " " << cmd_name << std::endl;

      strm << "StringStream status: good()=" << instr.good();
      strm << " eof()=" << instr.eof();
      strm << " fail()=" << instr.fail();
      strm << " bad()=" << instr.bad() << std::endl;
      debug(strm.str());
    }
  }

  if (log_level <= spdlog::level::debug) {
    std::stringstream strm;
    strm << "Parsed: ";
    for (const auto& value : nvidia_stats) {
      strm << value.first << ": " << value.second.get_value() << ";";
    }
    debug(strm.str());
  }
}